

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O2

void Unit_Test::generateOffset(Image *image,uint32_t *x,uint32_t *y,uint32_t width,uint32_t height)

{
  uint uVar1;
  
  uVar1 = Test_Helper::randomValue<unsigned_int>(image->_width - width);
  *x = uVar1;
  uVar1 = Test_Helper::randomValue<unsigned_int>(image->_height - height);
  *y = uVar1;
  return;
}

Assistant:

void generateOffset( const PenguinV_Image::Image & image, uint32_t & x, uint32_t & y, uint32_t width, uint32_t height )
    {
        x = randomValue<uint32_t>( image.width()  - width );
        y = randomValue<uint32_t>( image.height() - height );
    }